

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O0

void mbedtls_ssl_cookie_free(mbedtls_ssl_cookie_ctx *ctx)

{
  mbedtls_ssl_cookie_ctx *ctx_local;
  
  mbedtls_md_free(&ctx->hmac_ctx);
  mbedtls_platform_zeroize(ctx,0x28);
  return;
}

Assistant:

void mbedtls_ssl_cookie_free(mbedtls_ssl_cookie_ctx *ctx)
{
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    psa_destroy_key(ctx->psa_hmac_key);
#else
    mbedtls_md_free(&ctx->hmac_ctx);

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_free(&ctx->mutex);
#endif
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    mbedtls_platform_zeroize(ctx, sizeof(mbedtls_ssl_cookie_ctx));
}